

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleDictionaryEntry<IR::Instr_*,_IR::Instr_*> * __thiscall
Memory::
AllocateArray<Memory::JitArenaAllocator,JsUtil::SimpleDictionaryEntry<IR::Instr*,IR::Instr*>,false>
          (Memory *this,JitArenaAllocator *allocator,offset_in_JitArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  undefined1 auVar1 [16];
  SimpleDictionaryEntry<IR::Instr_*,_IR::Instr_*> *pSVar2;
  size_t byteSize;
  
  if (count != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    pSVar2 = (SimpleDictionaryEntry<IR::Instr_*,_IR::Instr_*> *)
             new__<Memory::JitArenaAllocator>
                       (byteSize,(JitArenaAllocator *)this,
                        (offset_in_JitArenaAllocator_to_subr)allocator);
    return pSVar2;
  }
  return (SimpleDictionaryEntry<IR::Instr_*,_IR::Instr_*> *)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}